

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lexicon.h
# Opt level: O0

size_t __thiscall
SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher::operator()
          (IdHasher *this,uint32 id)

{
  bool bVar1;
  reference piVar2;
  size_t sVar3;
  int *value;
  Iterator __end0;
  Iterator __begin0;
  Sequence *__range1;
  HashMix mix;
  uint32 id_local;
  IdHasher *this_local;
  
  mix.hash_._4_4_ = id;
  HashMix::HashMix((HashMix *)&__range1);
  ___begin0 = sequence(this->lexicon_,mix.hash_._4_4_);
  __end0 = Sequence::begin((Sequence *)&__begin0);
  value = (int *)Sequence::end((Sequence *)&__begin0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&value);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end0);
    sVar3 = std::hash<int>::operator()((hash<int> *)this,*piVar2);
    HashMix::Mix((HashMix *)&__range1,sVar3);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  sVar3 = HashMix::get((HashMix *)&__range1);
  return sVar3;
}

Assistant:

size_t SequenceLexicon<T, Hasher, KeyEqual>::IdHasher::operator()(
    uint32 id) const {
  HashMix mix;
  for (const auto& value : lexicon_->sequence(id)) {
    mix.Mix(hasher_(value));
  }
  return mix.get();
}